

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraph.h
# Opt level: O1

type __thiscall
dg::pta::PointerGraph::
nodeFactory<(dg::pta::PSNodeType)4,dg::pta::PSNode*&,unsigned_long_const&,dg::pta::PSNodeGep>
          (PointerGraph *this,PSNode **args,unsigned_long *args_1)

{
  int iVar1;
  PSNode *n;
  type tVar2;
  type pPVar3;
  
  pPVar3 = (type)operator_new(0xf0);
  iVar1 = *(int *)(this + 0x40);
  *(IDType *)(this + 0x40) = iVar1 + 1U;
  n = *args;
  tVar2 = *args_1;
  (pPVar3->super_PSNode).super_SubgraphNode<dg::pta::PSNode>.id = iVar1 + 1U;
  (pPVar3->super_PSNode).super_SubgraphNode<dg::pta::PSNode>.data = (void *)0x0;
  (pPVar3->super_PSNode).super_SubgraphNode<dg::pta::PSNode>.user_data = (void *)0x0;
  (pPVar3->super_PSNode).super_SubgraphNode<dg::pta::PSNode>.scc_id = 0;
  (pPVar3->super_PSNode).super_SubgraphNode<dg::pta::PSNode>._successors.
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pPVar3->super_PSNode).super_SubgraphNode<dg::pta::PSNode>._successors.
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pPVar3->super_PSNode).super_SubgraphNode<dg::pta::PSNode>._successors.
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pPVar3->super_PSNode).super_SubgraphNode<dg::pta::PSNode>._predecessors.
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pPVar3->super_PSNode).super_SubgraphNode<dg::pta::PSNode>._predecessors.
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pPVar3->super_PSNode).super_SubgraphNode<dg::pta::PSNode>._predecessors.
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pPVar3->super_PSNode).super_SubgraphNode<dg::pta::PSNode>.operands.
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pPVar3->super_PSNode).super_SubgraphNode<dg::pta::PSNode>.operands.
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pPVar3->super_PSNode).super_SubgraphNode<dg::pta::PSNode>.operands.
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pPVar3->super_PSNode).super_SubgraphNode<dg::pta::PSNode>.users.
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pPVar3->super_PSNode).super_SubgraphNode<dg::pta::PSNode>.users.
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pPVar3->super_PSNode).super_SubgraphNode<dg::pta::PSNode>.users.
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pPVar3->super_PSNode).super_SubgraphNode<dg::pta::PSNode>.size = 0;
  (pPVar3->super_PSNode)._vptr_PSNode = (_func_int **)&PTR__PSNode_0012bb58;
  (pPVar3->super_PSNode).type = GEP;
  *(undefined8 *)
   ((long)&(pPVar3->super_PSNode).pointsTo.pointers._bits.
           super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
           .
           super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           ._M_h + 0x20) = 0;
  *(size_t *)
   ((long)&(pPVar3->super_PSNode).pointsTo.pointers._bits.
           super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
           .
           super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           ._M_h + 0x28) = 0;
  *(__node_base_ptr *)
   ((long)&(pPVar3->super_PSNode).pointsTo.pointers._bits.
           super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
           .
           super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           ._M_h + 0x30) = (__node_base_ptr)0x0;
  (pPVar3->super_PSNode).pointsTo.pointers._bits.
  super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
  .
  super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ._M_h._M_buckets = (__buckets_ptr)0x0;
  *(size_type *)
   ((long)&(pPVar3->super_PSNode).pointsTo.pointers._bits.
           super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
           .
           super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           ._M_h + 8) = 0;
  ((__node_base *)
  ((long)&(pPVar3->super_PSNode).pointsTo.pointers._bits.
          super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
          .
          super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          ._M_h + 0x10))->_M_nxt = (_Hash_node_base *)0x0;
  *(size_type *)
   ((long)&(pPVar3->super_PSNode).pointsTo.pointers._bits.
           super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
           .
           super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           ._M_h + 0x18) = 0;
  (pPVar3->super_PSNode).dfsid = 0;
  (pPVar3->super_PSNode).pairedNode = (PSNode *)0x0;
  (pPVar3->super_PSNode)._parent = (PointerSubgraph *)0x0;
  (pPVar3->super_PSNode).pointsTo.pointers._bits.
  super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
  .
  super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ._M_h._M_buckets =
       (__node_base_ptr *)
       ((long)&(pPVar3->super_PSNode).pointsTo.pointers._bits.
               super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
               .
               super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
               ._M_h + 0x30);
  *(size_type *)
   ((long)&(pPVar3->super_PSNode).pointsTo.pointers._bits.
           super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
           .
           super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           ._M_h + 8) = 1;
  ((__node_base *)
  ((long)&(pPVar3->super_PSNode).pointsTo.pointers._bits.
          super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
          .
          super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          ._M_h + 0x10))->_M_nxt = (_Hash_node_base *)0x0;
  *(size_type *)
   ((long)&(pPVar3->super_PSNode).pointsTo.pointers._bits.
           super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
           .
           super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           ._M_h + 0x18) = 0;
  ((_Prime_rehash_policy *)
  ((long)&(pPVar3->super_PSNode).pointsTo.pointers._bits.
          super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
          .
          super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          ._M_h + 0x20))->_M_max_load_factor = 1.0;
  *(size_t *)
   ((long)&(pPVar3->super_PSNode).pointsTo.pointers._bits.
           super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
           .
           super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           ._M_h + 0x28) = 0;
  *(__node_base_ptr *)
   ((long)&(pPVar3->super_PSNode).pointsTo.pointers._bits.
           super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
           .
           super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           ._M_h + 0x30) = (__node_base_ptr)0x0;
  SubgraphNode<dg::pta::PSNode>::addOperand<dg::pta::PSNode*,dg::pta::PSNode>
            (&(pPVar3->super_PSNode).super_SubgraphNode<dg::pta::PSNode>,n);
  (pPVar3->super_PSNode)._vptr_PSNode = (_func_int **)&PTR__PSNode_0012bc60;
  (pPVar3->offset).offset = tVar2;
  return pPVar3;
}

Assistant:

typename std::enable_if<!std::is_same<Node, PSNode>::value, Node *>::type
    nodeFactory(Args &&...args) {
        return new Node(getNewNodeId(), std::forward<Args>(args)...);
    }